

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  byte bVar1;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  char *__ptr;
  per_transfer **per;
  _Bool skipped_1;
  _Bool getadded;
  _Bool skipped;
  undefined8 local_48;
  _Bool *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  local_38 = multi;
  if (all_pers < (long)(ulong)((uint)global->parallel_max * 2)) {
    skipped = false;
    do {
      CVar2 = create_transfer(global,share,addedp,&skipped);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    } while (skipped != false);
  }
  per = &transfers;
  local_48 = 0;
  local_40 = morep;
LAB_00115d0c:
  do {
    per = &((per_transfer *)per)->next->next;
    if ((per_transfer *)per == (per_transfer *)0x0) {
      bVar1 = (byte)local_48;
LAB_00115e9a:
      *local_40 = (_Bool)(bVar1 & 1);
      return CURLE_OK;
    }
    if ((long)(ulong)global->parallel_max <= all_added) {
      bVar1 = 1;
      goto LAB_00115e9a;
    }
    bVar1 = ((per_transfer *)per)->field_0x1d8;
  } while ((bVar1 & 0x28) != 0);
  if (((per_transfer *)per)->startat != 0) {
    tVar4 = time((time_t *)0x0);
    if (tVar4 < ((per_transfer *)per)->startat) {
      local_48 = CONCAT71((int7)((ulong)tVar4 >> 8),1);
      goto LAB_00115d0c;
    }
    bVar1 = ((per_transfer *)per)->field_0x1d8;
  }
  ((per_transfer *)per)->field_0x1d8 = bVar1 | 8;
  CVar2 = pre_transfer(global,(per_transfer *)per);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  __ptr = (char *)malloc(0x100);
  if (__ptr == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  curl_easy_setopt(((per_transfer *)per)->curl,0xed,(*(ushort *)&global->field_0x63 & 2) == 0);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2777,per);
  curl_easy_setopt(((per_transfer *)per)->curl,0x4efb,xferinfo_cb);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2749,per);
  curl_easy_setopt(((per_transfer *)per)->curl,0x2b,0);
  iVar3 = curl_multi_add_handle(local_38,((per_transfer *)per)->curl);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (iVar3 != 0) {
LAB_00115e83:
    free(__ptr);
    return CVar2;
  }
  getadded = false;
  skipped_1 = false;
  do {
    CVar2 = create_transfer(global,share,&getadded,&skipped_1);
    if (CVar2 != CURLE_OK) goto LAB_00115e83;
  } while (skipped_1 != false);
  *__ptr = '\0';
  curl_easy_setopt(((per_transfer *)per)->curl,0x271a,__ptr);
  ((per_transfer *)per)->errorbuffer = __ptr;
  ((per_transfer *)per)->field_0x1d8 = ((per_transfer *)per)->field_0x1d8 | 8;
  all_added = all_added + 1;
  *addedp = true;
  goto LAB_00115d0c;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    bool skipped = FALSE;
    do {
      result = create_transfer(global, share, addedp, &skipped);
      if(result)
        return result;
    } while(skipped);
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    if(per->added || per->skip)
      /* already added or to be skipped */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result) {
      bool getadded = FALSE;
      bool skipped = FALSE;
      do {
        result = create_transfer(global, share, &getadded, &skipped);
        if(result)
          break;
      } while(skipped);
    }
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping);
  return CURLE_OK;
}